

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)

{
  fdb_status fVar1;
  list_elem *plVar2;
  fdb_file_handle *pfVar3;
  list_elem *plVar4;
  list_elem **__ptr;
  
  pthread_spin_lock(&root_handle->fhandle->lock);
  pfVar3 = root_handle->fhandle;
  plVar4 = pfVar3->handles->head;
  if (plVar4 == (list_elem *)0x0) {
    fVar1 = FDB_RESULT_SUCCESS;
  }
  else {
    do {
      plVar2 = list_remove(root_handle->fhandle->handles,plVar4);
      fVar1 = _fdb_close((fdb_kvs_handle *)plVar4[-1].next);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00131077;
      __ptr = &plVar4[-1].next;
      plVar4 = *__ptr;
      if (plVar4[1].next != (list_elem *)0x0) {
        free(plVar4[1].next);
        plVar4[1].next = (list_elem *)0x0;
        plVar4 = *__ptr;
      }
      free(plVar4);
      free(__ptr);
      plVar4 = plVar2;
    } while (plVar2 != (list_elem *)0x0);
    fVar1 = FDB_RESULT_SUCCESS;
LAB_00131077:
    pfVar3 = root_handle->fhandle;
  }
  pthread_spin_unlock(&pfVar3->lock);
  return fVar1;
}

Assistant:

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)
{
    fdb_status fs;
    struct list_elem *e;
    struct kvs_opened_node *node;

    spin_lock(&root_handle->fhandle->lock);
    e = list_begin(root_handle->fhandle->handles);
    while (e) {
        node = _get_entry(e, struct kvs_opened_node, le);
        e = list_remove(root_handle->fhandle->handles, &node->le);
        fs = _fdb_close(node->handle);
        if (fs != FDB_RESULT_SUCCESS) {
            spin_unlock(&root_handle->fhandle->lock);
            return fs;
        }
        fdb_kvs_info_free(node->handle);
        free(node->handle);
        free(node);
    }
    spin_unlock(&root_handle->fhandle->lock);

    return FDB_RESULT_SUCCESS;
}